

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

uint32_t __thiscall
cppnet::BufferQueue::GetUseMemoryBlock
          (BufferQueue *this,vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec,
          uint32_t max_size)

{
  pointer *ppIVar1;
  iterator iVar2;
  element_type *peVar3;
  ulong uVar4;
  uint32_t uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  uint32_t mem_len_2;
  uint32_t mem_len_1;
  void *mem_2;
  void *mem_1;
  uint32_t local_64;
  uint32_t local_60;
  uint32_t local_5c;
  Iovec local_58;
  void *local_48;
  void *local_40;
  BufferQueue *local_38;
  
  uVar5 = 0;
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  local_60 = 0;
  local_64 = 0;
  local_5c = max_size;
  std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::reserve(block_vec,8);
  this_01 = (this->_buffer_list)._head.
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_02 = (this->_buffer_list)._head.
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  local_38 = this;
  if (this_01 != (element_type *)0x0) {
    local_5c = local_5c - 1;
    uVar5 = 0;
    this_00 = this_02;
    do {
      BufferBlock::GetUseMemoryBlock(this_01,&local_40,&local_60,&local_48,&local_64);
      uVar4 = (ulong)local_60;
      if (uVar4 != 0) {
        local_58._iov_base = local_40;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_58._iov_len = uVar4;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_58);
        }
        else {
          (iVar2._M_current)->_iov_base = local_40;
          (iVar2._M_current)->_iov_len = uVar4;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar5 = uVar5 + local_60;
      }
      uVar4 = (ulong)local_64;
      if (uVar4 != 0) {
        local_58._iov_base = local_48;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_58._iov_len = uVar4;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_58);
        }
        else {
          (iVar2._M_current)->_iov_base = local_48;
          (iVar2._M_current)->_iov_len = uVar4;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar5 = uVar5 + local_64;
      }
      this_02 = this_00;
      if ((this_01 ==
           (local_38->_buffer_write).
           super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
         (local_5c < uVar5)) break;
      peVar3 = (this_01->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_02 = (this_01->super_ListSlot<cppnet::BufferBlock>)._next.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      this_00 = this_02;
      this_01 = peVar3;
    } while (peVar3 != (element_type *)0x0);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  return uVar5;
}

Assistant:

uint32_t BufferQueue::GetUseMemoryBlock(std::vector<Iovec>& block_vec, uint32_t max_size) {
    void* mem_1 = nullptr;
    void* mem_2 = nullptr;
    uint32_t mem_len_1 = 0;
    uint32_t mem_len_2 = 0;

    block_vec.reserve(__block_vec_default_size);
    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t cur_len = 0;
    while (temp) {
        temp->GetUseMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
        if (mem_len_1 > 0) {
            block_vec.emplace_back(Iovec(mem_1, mem_len_1));
            cur_len += mem_len_1;
        }
        if (mem_len_2 > 0) {
            block_vec.emplace_back(Iovec(mem_2, mem_len_2));
            cur_len += mem_len_2;
        }
        if (temp == _buffer_write) {
            break;
        }
        if (max_size > 0 && cur_len >= max_size) {
            break;
        }
        temp = temp->GetNext();
    }
    return cur_len;
}